

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O2

bool __thiscall
r_exec::HLPBindingMap::match_bwd_strict(HLPBindingMap *this,_Fact *f_object,_Fact *f_pattern)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Fact *f_pattern_00;
  
  iVar3 = (*(f_object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(f_object,0);
  iVar4 = (*(f_pattern->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(f_pattern,0);
  bVar1 = BindingMap::match_object
                    (&this->super_BindingMap,(Code *)CONCAT44(extraout_var,iVar3),
                     (Code *)CONCAT44(extraout_var_00,iVar4));
  if (bVar1) {
    iVar3 = (*(f_object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
              .super_Code.super__Object._vptr__Object[5])(f_object,0);
    iVar4 = (*(f_pattern->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object._vptr__Object[5])(f_pattern,0);
    cVar2 = r_code::Atom::operator!=
                      ((Atom *)CONCAT44(extraout_var_01,iVar3),
                       (Atom *)CONCAT44(extraout_var_02,iVar4));
    if (cVar2 == '\0') {
      bVar1 = match_bwd_timings(this,f_object,f_pattern_00);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool HLPBindingMap::match_bwd_strict(const _Fact *f_object, const _Fact *f_pattern)
{
    if (match_object(f_object->get_reference(0), f_pattern->get_reference(0))) {
        if (f_object->code(0) != f_pattern->code(0)) {
            return false;
        }

        return match_bwd_timings(f_object, f_pattern);
    } else {
        return false;
    }
}